

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void Search::parse_neighbor_features(string *nf_string,search *sch)

{
  substring s;
  substring s_00;
  substring s_01;
  char *__dest;
  char *pcVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  undefined8 *in_RSI;
  int32_t enc;
  char ns;
  int32_t posn;
  substring me;
  vector<substring,_std::allocator<substring>_> cmd;
  char *p;
  char *cstr;
  size_t len;
  search_private *priv;
  int *in_stack_fffffffffffffef8;
  v_array<int> *in_stack_ffffffffffffff00;
  ostream *in_stack_ffffffffffffff10;
  byte local_d9;
  int in_stack_ffffffffffffff34;
  vector<substring,_std::allocator<substring>_> *ret;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  byte local_79;
  int local_78;
  vector<substring,_std::allocator<substring>_> local_48;
  char *local_30;
  char *local_28;
  long local_20;
  undefined8 local_18;
  
  local_18 = *in_RSI;
  v_array<int>::clear(in_stack_ffffffffffffff00);
  local_20 = std::__cxx11::string::length();
  if (local_20 != 0) {
    __dest = (char *)operator_new__(local_20 + 1);
    local_28 = __dest;
    pcVar1 = (char *)std::__cxx11::string::c_str();
    strcpy(__dest,pcVar1);
    local_30 = strtok(local_28,",");
    std::vector<substring,_std::allocator<substring>_>::vector
              ((vector<substring,_std::allocator<substring>_> *)0x3b7e09);
    while (local_30 != (char *)0x0) {
      ret = &local_48;
      std::vector<substring,_std::allocator<substring>_>::clear
                ((vector<substring,_std::allocator<substring>_> *)0x3b7e2a);
      pcVar1 = local_30;
      strlen(local_30);
      s.end._0_4_ = in_stack_ffffffffffffff50;
      s.begin = __dest;
      s.end._4_4_ = in_stack_ffffffffffffff54;
      tokenize<std::vector<substring,std::allocator<substring>>>
                ((char)((ulong)pcVar1 >> 0x38),s,ret,
                 SUB41((uint)in_stack_ffffffffffffff34 >> 0x18,0));
      local_78 = 0;
      local_79 = 0x20;
      sVar2 = std::vector<substring,_std::allocator<substring>_>::size(&local_48);
      if (sVar2 == 1) {
        pvVar3 = std::vector<substring,_std::allocator<substring>_>::operator[](&local_48,0);
        in_stack_ffffffffffffff68 = pvVar3->begin;
        in_stack_ffffffffffffff70 = pvVar3->end;
        s_01.begin = pvVar3->begin;
        s_01.end = pvVar3->end;
        in_stack_ffffffffffffff34 = int_of_substring(s_01);
        local_79 = 0x20;
        local_78 = in_stack_ffffffffffffff34;
      }
      else {
        sVar2 = std::vector<substring,_std::allocator<substring>_>::size(&local_48);
        if (sVar2 == 2) {
          std::vector<substring,_std::allocator<substring>_>::operator[](&local_48,0);
          s_00.end = in_stack_ffffffffffffff70;
          s_00.begin = in_stack_ffffffffffffff68;
          local_78 = int_of_substring(s_00);
          pvVar3 = std::vector<substring,_std::allocator<substring>_>::operator[](&local_48,1);
          pcVar1 = pvVar3->end;
          pvVar3 = std::vector<substring,_std::allocator<substring>_>::operator[](&local_48,1);
          if (pvVar3->begin < pcVar1) {
            pvVar3 = std::vector<substring,_std::allocator<substring>_>::operator[](&local_48,1);
            local_d9 = *pvVar3->begin;
          }
          else {
            local_d9 = 0x20;
          }
          local_79 = local_d9;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "warning: ignoring malformed neighbor specification: \'");
          in_stack_ffffffffffffff10 = std::operator<<(poVar4,local_30);
          poVar4 = std::operator<<(in_stack_ffffffffffffff10,"\'");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        }
      }
      in_stack_ffffffffffffff54 = local_78 << 0x18 | (uint)local_79;
      v_array<int>::push_back(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      local_30 = strtok((char *)0x0,",");
    }
    if (local_28 != (char *)0x0) {
      operator_delete__(local_28);
    }
    std::vector<substring,_std::allocator<substring>_>::~vector
              ((vector<substring,_std::allocator<substring>_> *)in_stack_ffffffffffffff10);
  }
  return;
}

Assistant:

void parse_neighbor_features(string& nf_string, search& sch)
{
  search_private& priv = *sch.priv;
  priv.neighbor_features.clear();
  size_t len = nf_string.length();
  if (len == 0)
    return;

  char* cstr = new char[len + 1];
  strcpy(cstr, nf_string.c_str());

  char* p = strtok(cstr, ",");
  std::vector<substring> cmd;
  while (p != 0)
  {
    cmd.clear();
    substring me = {p, p + strlen(p)};
    tokenize(':', me, cmd, true);

    int32_t posn = 0;
    char ns = ' ';
    if (cmd.size() == 1)
    {
      posn = int_of_substring(cmd[0]);
      ns = ' ';
    }
    else if (cmd.size() == 2)
    {
      posn = int_of_substring(cmd[0]);
      ns = (cmd[1].end > cmd[1].begin) ? cmd[1].begin[0] : ' ';
    }
    else
    {
      std::cerr << "warning: ignoring malformed neighbor specification: '" << p << "'" << endl;
    }
    int32_t enc = (posn << 24) | (ns & 0xFF);
    priv.neighbor_features.push_back(enc);

    p = strtok(nullptr, ",");
  }

  delete[] cstr;
}